

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

float ImGui::GetNavInputAmount(ImGuiNavInput n,ImGuiInputReadMode mode)

{
  float fVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  if (mode == ImGuiInputReadMode_Down) {
    return (GImGui->IO).NavInputs[n];
  }
  fVar1 = (GImGui->IO).NavInputsDownDuration[n];
  if ((mode == ImGuiInputReadMode_Released) && (fVar1 < 0.0)) {
    return (float)(-(uint)(0.0 <= (GImGui->IO).NavInputsDownDurationPrev[n]) & 0x3f800000);
  }
  fVar3 = 0.0;
  if (0.0 <= fVar1) {
    switch(mode) {
    case ImGuiInputReadMode_Pressed:
      return (float)(-(uint)(fVar1 == 0.0) & 0x3f800000);
    default:
      goto switchD_0014be87_caseD_2;
    case ImGuiInputReadMode_Repeat:
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return 1.0;
      }
      fVar4 = (GImGui->IO).KeyRepeatDelay * 0.8;
      if (fVar1 <= fVar4) {
        return fVar3;
      }
      fVar5 = (GImGui->IO).KeyRepeatRate * 0.8;
      if (fVar5 <= 0.0) {
        return fVar3;
      }
      fVar3 = (fVar1 - fVar4) / fVar5;
      fVar5 = ((fVar1 - (GImGui->IO).DeltaTime) - fVar4) / fVar5;
      goto LAB_0014bf6e;
    case ImGuiInputReadMode_RepeatSlow:
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return 1.0;
      }
      fVar4 = (GImGui->IO).KeyRepeatDelay;
      if (fVar1 <= fVar4) {
        return fVar3;
      }
      fVar5 = (GImGui->IO).KeyRepeatRate;
      fVar5 = fVar5 + fVar5;
      break;
    case ImGuiInputReadMode_RepeatFast:
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return 1.0;
      }
      fVar4 = (GImGui->IO).KeyRepeatDelay * 0.8;
      if (fVar1 <= fVar4) {
        return fVar3;
      }
      fVar5 = (GImGui->IO).KeyRepeatRate * 0.3;
    }
    if (0.0 < fVar5) {
      fVar3 = (fVar1 - fVar4) / fVar5;
      fVar5 = ((fVar1 - (GImGui->IO).DeltaTime) - fVar4) / fVar5;
LAB_0014bf6e:
      iVar2 = 0;
      if (0 < (int)fVar3 - (int)fVar5) {
        iVar2 = (int)fVar3 - (int)fVar5;
      }
      return (float)iVar2;
    }
  }
switchD_0014be87_caseD_2:
  return fVar3;
}

Assistant:

float ImGui::GetNavInputAmount(ImGuiNavInput n, ImGuiInputReadMode mode)
{
    ImGuiContext& g = *GImGui;
    if (mode == ImGuiInputReadMode_Down)
        return g.IO.NavInputs[n];                         // Instant, read analog input (0.0f..1.0f, as provided by user)

    const float t = g.IO.NavInputsDownDuration[n];
    if (t < 0.0f && mode == ImGuiInputReadMode_Released)  // Return 1.0f when just released, no repeat, ignore analog input.
        return (g.IO.NavInputsDownDurationPrev[n] >= 0.0f ? 1.0f : 0.0f);
    if (t < 0.0f)
        return 0.0f;
    if (mode == ImGuiInputReadMode_Pressed)               // Return 1.0f when just pressed, no repeat, ignore analog input.
        return (t == 0.0f) ? 1.0f : 0.0f;
    if (mode == ImGuiInputReadMode_Repeat)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 0.80f, g.IO.KeyRepeatRate * 0.80f);
    if (mode == ImGuiInputReadMode_RepeatSlow)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 1.00f, g.IO.KeyRepeatRate * 2.00f);
    if (mode == ImGuiInputReadMode_RepeatFast)
        return (float)CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay * 0.80f, g.IO.KeyRepeatRate * 0.30f);
    return 0.0f;
}